

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepLoop.h
# Opt level: O0

void anurbs::BrepLoop::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *pcVar1;
  arg aVar2;
  undefined1 local_d0;
  arg local_c8;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  handle local_48;
  class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_>::class_<>
            (&local_40,local_48,name_00);
  local_68 = brep;
  local_60 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<anurbs::Ref<anurbs::Brep>(anurbs::BrepLoop::*)()const>
                     ((class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)&local_40,"brep"
                      ,(offset_in_Model_to_subr *)&local_68);
  local_78 = edges;
  local_70 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepEdge>,std::allocator<anurbs::Ref<anurbs::BrepEdge>>>(anurbs::BrepLoop::*)()const>
                     (pcVar1,"edges",(offset_in_Model_to_subr *)&local_78);
  local_88 = face;
  local_80 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepFace>(anurbs::BrepLoop::*)()const>
                     (pcVar1,"face",(offset_in_Model_to_subr *)&local_88);
  local_98 = nb_trims;
  local_90 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<unsigned_long(anurbs::BrepLoop::*)()const>
                     (pcVar1,"nb_trims",(offset_in_Model_to_subr *)&local_98);
  local_a8 = trims;
  local_a0 = 0;
  pcVar1 = (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepTrim>,std::allocator<anurbs::Ref<anurbs::BrepTrim>>>(anurbs::BrepLoop::*)()const>
                     (pcVar1,"trims",(offset_in_Model_to_subr *)&local_a8);
  local_b8 = trim;
  local_b0 = 0;
  aVar2 = pybind11::literals::operator____a("index",5);
  local_c8.name = aVar2.name;
  local_d0 = aVar2._8_1_;
  local_c8._8_1_ = local_d0;
  pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
  def<anurbs::Ref<anurbs::BrepTrim>(anurbs::BrepLoop::*)(unsigned_long)const,pybind11::arg>
            (pcVar1,"trim",(offset_in_Model_to_subr *)&local_b8,&local_c8);
  pybind11::class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_>::~class_(&local_40);
  Model::register_python_data_type<anurbs::BrepLoop>(m,model);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepLoop;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("brep", &Type::brep)
            .def_property_readonly("edges", &Type::edges)
            .def_property_readonly("face", &Type::face)
            .def_property_readonly("nb_trims", &Type::nb_trims)
            .def_property_readonly("trims", &Type::trims)
            // methods
            .def("trim", &Type::trim, "index"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }